

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O0

void __thiscall
cmInstallCommandArguments::cmInstallCommandArguments
          (cmInstallCommandArguments *this,string *defaultComponent)

{
  string *defaultComponent_local;
  cmInstallCommandArguments *this_local;
  
  cmCommandArgumentsHelper::cmCommandArgumentsHelper(&this->Parser);
  cmCommandArgumentGroup::cmCommandArgumentGroup(&this->ArgumentGroup);
  cmCAString::cmCAString(&this->Destination,&this->Parser,"DESTINATION",&this->ArgumentGroup);
  cmCAString::cmCAString(&this->Component,&this->Parser,"COMPONENT",&this->ArgumentGroup);
  cmCAString::cmCAString
            (&this->NamelinkComponent,&this->Parser,"NAMELINK_COMPONENT",&this->ArgumentGroup);
  cmCAEnabler::cmCAEnabler
            (&this->ExcludeFromAll,&this->Parser,"EXCLUDE_FROM_ALL",&this->ArgumentGroup);
  cmCAString::cmCAString(&this->Rename,&this->Parser,"RENAME",&this->ArgumentGroup);
  cmCAStringVector::cmCAStringVector
            (&this->Permissions,&this->Parser,"PERMISSIONS",&this->ArgumentGroup);
  cmCAStringVector::cmCAStringVector
            (&this->Configurations,&this->Parser,"CONFIGURATIONS",&this->ArgumentGroup);
  cmCAEnabler::cmCAEnabler(&this->Optional,&this->Parser,"OPTIONAL",&this->ArgumentGroup);
  cmCAEnabler::cmCAEnabler(&this->NamelinkOnly,&this->Parser,"NAMELINK_ONLY",&this->ArgumentGroup);
  cmCAEnabler::cmCAEnabler(&this->NamelinkSkip,&this->Parser,"NAMELINK_SKIP",&this->ArgumentGroup);
  cmCAString::cmCAString(&this->Type,&this->Parser,"TYPE",&this->ArgumentGroup);
  std::__cxx11::string::string((string *)&this->DestinationString);
  std::__cxx11::string::string((string *)&this->PermissionsString);
  this->GenericArguments = (cmInstallCommandArguments *)0x0;
  std::__cxx11::string::string((string *)&this->DefaultComponentName,(string *)defaultComponent);
  return;
}

Assistant:

cmInstallCommandArguments::cmInstallCommandArguments(
  std::string defaultComponent)
  : Destination(&Parser, "DESTINATION", &ArgumentGroup)
  , Component(&Parser, "COMPONENT", &ArgumentGroup)
  , NamelinkComponent(&Parser, "NAMELINK_COMPONENT", &ArgumentGroup)
  , ExcludeFromAll(&Parser, "EXCLUDE_FROM_ALL", &ArgumentGroup)
  , Rename(&Parser, "RENAME", &ArgumentGroup)
  , Permissions(&Parser, "PERMISSIONS", &ArgumentGroup)
  , Configurations(&Parser, "CONFIGURATIONS", &ArgumentGroup)
  , Optional(&Parser, "OPTIONAL", &ArgumentGroup)
  , NamelinkOnly(&Parser, "NAMELINK_ONLY", &ArgumentGroup)
  , NamelinkSkip(&Parser, "NAMELINK_SKIP", &ArgumentGroup)
  , Type(&Parser, "TYPE", &ArgumentGroup)
  , GenericArguments(nullptr)
  , DefaultComponentName(std::move(defaultComponent))
{
}